

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O3

int __thiscall
Ptex::v2_2::PtexWriterBase::readBlock(PtexWriterBase *this,FILE *fp,void *data,int size)

{
  size_t sVar1;
  long *local_40 [2];
  long local_30 [2];
  
  sVar1 = fread(data,(long)size,1,(FILE *)fp);
  if (sVar1 == 0) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"PtexWriter error: temp file read failed","");
    std::__cxx11::string::_M_assign((string *)&this->_error);
    this->_ok = false;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    size = 0;
  }
  return size;
}

Assistant:

int PtexWriterBase::readBlock(FILE* fp, void* data, int size)
{
    if (!fread(data, size, 1, fp)) {
        setError("PtexWriter error: temp file read failed");
        return 0;
    }
    return size;
}